

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

int cuddHashTableResize(DdHashTable *hash)

{
  uint uVar1;
  DdHashItem **__ptr;
  DdHashItem *pDVar2;
  DdHashItem *pDVar3;
  _func_void_long *p_Var4;
  int extraout_EAX;
  ulong uVar5;
  DdHashItem **__s;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  size_t __size;
  
  p_Var4 = Extra_UtilMMoutOfMemory;
  __ptr = hash->bucket;
  uVar11 = hash->numBuckets;
  uVar5 = (ulong)uVar11;
  Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
  __size = (long)(int)(uVar11 * 2) << 3;
  __s = (DdHashItem **)malloc(__size);
  Extra_UtilMMoutOfMemory = p_Var4;
  if (__s == (DdHashItem **)0x0) {
    hash->maxsize = hash->maxsize << 1;
    iVar9 = 0;
  }
  else {
    hash->bucket = __s;
    hash->numBuckets = uVar11 * 2;
    iVar9 = hash->shift + -1;
    hash->shift = iVar9;
    hash->maxsize = hash->maxsize << 1;
    memset(__s,0,__size);
    uVar1 = hash->keysize;
    uVar6 = (ulong)uVar1;
    bVar7 = (byte)iVar9;
    if (uVar6 == 1) {
      if (0 < (int)uVar11) {
        uVar6 = 0;
        do {
          pDVar3 = __ptr[uVar6];
          while (pDVar3 != (DdHashItem *)0x0) {
            pDVar2 = pDVar3->next;
            uVar11 = (((uint)pDVar3->key[0] & 1) +
                     *(int *)(((ulong)pDVar3->key[0] & 0xfffffffffffffffe) + 0x20) * 2) * 0x7c45abd6
                     >> (bVar7 & 0x1f);
            pDVar3->next = __s[uVar11];
            __s[uVar11] = pDVar3;
            pDVar3 = pDVar2;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
      }
    }
    else if (uVar1 == 2) {
      if (0 < (int)uVar11) {
        uVar6 = 0;
        do {
          pDVar3 = __ptr[uVar6];
          while (pDVar3 != (DdHashItem *)0x0) {
            pDVar2 = pDVar3->next;
            uVar11 = (((uint)pDVar3[1].next & 1) +
                      *(int *)(((ulong)pDVar3[1].next & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar3->key[0] & 1) +
                     *(int *)(((ulong)pDVar3->key[0] & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005)
                     * 0x40f1f9 >> (bVar7 & 0x1f);
            pDVar3->next = __s[uVar11];
            __s[uVar11] = pDVar3;
            pDVar3 = pDVar2;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
      }
    }
    else if (uVar1 == 3) {
      if (0 < (int)uVar11) {
        uVar6 = 0;
        do {
          pDVar3 = __ptr[uVar6];
          while (pDVar3 != (DdHashItem *)0x0) {
            pDVar2 = pDVar3->next;
            uVar11 = (((uint)pDVar3[1].count & 1) +
                      *(int *)((pDVar3[1].count & 0xfffffffffffffffeU) + 0x20) * 2 +
                     (((uint)pDVar3->key[0] & 1) +
                      *(int *)(((ulong)pDVar3->key[0] & 0xfffffffffffffffe) + 0x20) * 2 +
                     ((uint)pDVar3[1].next & 1) +
                     *(int *)(((ulong)pDVar3[1].next & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005)
                     * 0x40f1f9 >> (bVar7 & 0x1f);
            pDVar3->next = __s[uVar11];
            __s[uVar11] = pDVar3;
            pDVar3 = pDVar2;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
      }
    }
    else if (0 < (int)uVar11) {
      uVar10 = 0;
      do {
        pDVar3 = __ptr[uVar10];
        while (pDVar3 != (DdHashItem *)0x0) {
          uVar11 = *(int *)pDVar3->key * 0x40f1f9;
          if (1 < uVar1) {
            lVar8 = 0;
            do {
              uVar11 = uVar11 * 0xc00005 + *(int *)(pDVar3[1].key + lVar8 + -3);
              lVar8 = lVar8 + 1;
            } while (uVar6 - 1 != lVar8);
          }
          pDVar2 = pDVar3->next;
          uVar11 = uVar11 >> (bVar7 & 0x1f);
          pDVar3->next = __s[uVar11];
          __s[uVar11] = pDVar3;
          pDVar3 = pDVar2;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar5);
    }
    iVar9 = (int)uVar6;
    if (__ptr != (DdHashItem **)0x0) {
      free(__ptr);
      return extraout_EAX;
    }
  }
  return iVar9;
}

Assistant:

static int
cuddHashTableResize(
  DdHashTable * hash)
{
    int j;
    unsigned int posn;
    DdHashItem *item;
    DdHashItem *next;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdNode **key;
    int numBuckets;
    DdHashItem **buckets;
    DdHashItem **oldBuckets = hash->bucket;
#ifdef __osf__
#pragma pointer_size restore
#endif
    int shift;
    int oldNumBuckets = hash->numBuckets;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    /* Compute the new size of the table. */
    numBuckets = oldNumBuckets << 1;
    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    buckets = ABC_ALLOC(DdHashItem *, numBuckets);
    MMoutOfMemory = saveHandler;
    if (buckets == NULL) {
        hash->maxsize <<= 1;
        return(1);
    }

    hash->bucket = buckets;
    hash->numBuckets = numBuckets;
    shift = --(hash->shift);
    hash->maxsize <<= 1;
    memset(buckets, 0, numBuckets * sizeof(DdHashItem *));
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (hash->keysize == 1) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[0]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 2) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[1]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 3) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash3(cuddF2L(key[0]), cuddF2L(key[1]), cuddF2L(key[2]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                posn = ddLCHash(item->key, hash->keysize, shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    }
    ABC_FREE(oldBuckets);
    return(1);

}